

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

_ReductionJob * __thiscall
r_exec::_Mem::JobQueue<r_exec::_ReductionJob>::popJob(JobQueue<r_exec::_ReductionJob> *this)

{
  value_type p_Var1;
  size_type sVar2;
  reference pp_Var3;
  queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
  *this_00;
  _ReductionJob *r;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  JobQueue<r_exec::_ReductionJob> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m_popMutex);
  std::mutex::lock(&this->m_mutex);
  while( true ) {
    sVar2 = std::
            queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
            ::size(&this->m_jobs);
    if (sVar2 != 0) break;
    std::mutex::unlock(&this->m_mutex);
    std::condition_variable::wait((unique_lock *)&this->m_canPopCondition);
    std::mutex::lock(&this->m_mutex);
  }
  this_00 = &this->m_jobs;
  pp_Var3 = std::
            queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
            ::front(this_00);
  p_Var1 = *pp_Var3;
  std::
  queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
  ::pop(this_00);
  sVar2 = std::
          queue<r_exec::_ReductionJob_*,_std::deque<r_exec::_ReductionJob_*,_std::allocator<r_exec::_ReductionJob_*>_>_>
          ::size(this_00);
  if (sVar2 < 0x400) {
    std::condition_variable::notify_all();
  }
  std::mutex::unlock(&this->m_mutex);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return p_Var1;
}

Assistant:

Type *popJob()
        {
            std::unique_lock<std::mutex> lock(m_popMutex);
            m_mutex.lock();

            while (m_jobs.size() < 1) { // while, because of spurious wakeups
                m_mutex.unlock();
                m_canPopCondition.wait(lock);
                m_mutex.lock();
            }

            Type *r = m_jobs.front();
            m_jobs.pop();

            if (m_jobs.size() < 1024) {
                m_canPushCondition.notify_all();
            }

            m_mutex.unlock();
            return r;
        }